

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::GenerateInlineAccessorDefinitions
          (StringOneofFieldGenerator *this,Printer *printer,bool is_inline)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *this_00;
  allocator<char> local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_inline_local;
  Printer *printer_local;
  StringOneofFieldGenerator *this_local;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = is_inline;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50,&(this->super_StringFieldGenerator).variables_);
  pcVar2 = "";
  if ((variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    pcVar2 = "inline ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"inline",&local_71);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_50,&local_70);
  std::__cxx11::string::operator=((string *)this_00,pcVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = SupportsArenas((this->super_StringFieldGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$inline$const ::std::string& $classname$::$name$() const {\n  // @@protoc_insertion_point(field_get:$full_name$)\n  if (has_$name$()) {\n    return $oneof_prefix$$name$_.Get();\n  }\n  return *$default_variable$;\n}\n$inline$void $classname$::set_$name$(const ::std::string& value) {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.Set($default_variable$, value,\n      GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set:$full_name$)\n}\n$inline$void $classname$::set_$name$(const char* value) {\n  $null_check$  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.Set($default_variable$,\n      $string_piece$(value), GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_char:$full_name$)\n}\n$inline$void $classname$::set_$name$(const $pointer_type$* value,\n                             size_t size) {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.Set($default_variable$, $string_piece$(\n      reinterpret_cast<const char*>(value), size),\n      GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n}\n$inline$::std::string* $classname$::mutable_$name$() {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  return $oneof_prefix$$name$_.Mutable($default_variable$,\n      GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_mutable:$full_name$)\n}\n$inline$::std::string* $classname$::$release_name$() {\n  // @@protoc_insertion_point(field_release:$full_name$)\n  if (has_$name$()) {\n    clear_has_$oneof_name$();\n    return $oneof_prefix$$name$_.Release($default_variable$,\n        GetArenaNoVirtual());\n  } else {\n    return NULL;\n  }\n}\n$inline$::std::string* $classname$::unsa..." /* TRUNCATED STRING LITERAL */
                      );
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$inline$const ::std::string& $classname$::$name$() const {\n  // @@protoc_insertion_point(field_get:$full_name$)\n  if (has_$name$()) {\n    return $oneof_prefix$$name$_.GetNoArena();\n  }\n  return *$default_variable$;\n}\n$inline$void $classname$::set_$name$(const ::std::string& value) {\n  // @@protoc_insertion_point(field_set:$full_name$)\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena($default_variable$, value);\n  // @@protoc_insertion_point(field_set:$full_name$)\n}\n#if LANG_CXX11\n$inline$void $classname$::set_$name$(::std::string&& value) {\n  // @@protoc_insertion_point(field_set:$full_name$)\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena(\n    $default_variable$, ::std::move(value));\n  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n}\n#endif\n$inline$void $classname$::set_$name$(const char* value) {\n  $null_check$  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena($default_variable$,\n      $string_piece$(value));\n  // @@protoc_insertion_point(field_set_char:$full_name$)\n}\n$inline$void $classname$::set_$name$(const $pointer_type$* value, size_t size) {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena($default_variable$, $string_piece$(\n      reinterpret_cast<const char*>(value), size));\n  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n}\n$inline$::std::string* $classname$::mutable_$name$() {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return $oneof_prefix..." /* TRUNCATED STRING LITERAL */
                      );
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void StringOneofFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer,
                                  bool is_inline) const {
  std::map<string, string> variables(variables_);
  variables["inline"] = is_inline ? "inline " : "";
  if (SupportsArenas(descriptor_)) {
    printer->Print(
        variables,
        "$inline$const ::std::string& $classname$::$name$() const {\n"
        "  // @@protoc_insertion_point(field_get:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    return $oneof_prefix$$name$_.Get();\n"
        "  }\n"
        "  return *$default_variable$;\n"
        "}\n"
        "$inline$void $classname$::set_$name$(const ::std::string& value) {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.Set($default_variable$, value,\n"
        "      GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "}\n"
        "$inline$void $classname$::set_$name$(const char* value) {\n"
        "  $null_check$"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.Set($default_variable$,\n"
        "      $string_piece$(value), GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_char:$full_name$)\n"
        "}\n"
        "$inline$"
        "void $classname$::set_$name$(const $pointer_type$* value,\n"
        "                             size_t size) {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.Set($default_variable$, $string_piece$(\n"
        "      reinterpret_cast<const char*>(value), size),\n"
        "      GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n"
        "}\n"
        "$inline$::std::string* $classname$::mutable_$name$() {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  return $oneof_prefix$$name$_.Mutable($default_variable$,\n"
        "      GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
        "}\n"
        "$inline$::std::string* $classname$::$release_name$() {\n"
        "  // @@protoc_insertion_point(field_release:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    clear_has_$oneof_name$();\n"
        "    return $oneof_prefix$$name$_.Release($default_variable$,\n"
        "        GetArenaNoVirtual());\n"
        "  } else {\n"
        "    return NULL;\n"
        "  }\n"
        "}\n"
        "$inline$::std::string* $classname$::unsafe_arena_release_$name$() {\n"
        "  // "
        "@@protoc_insertion_point(field_unsafe_arena_release:$full_name$)\n"
        "  GOOGLE_DCHECK(GetArenaNoVirtual() != NULL);\n"
        "  if (has_$name$()) {\n"
        "    clear_has_$oneof_name$();\n"
        "    return $oneof_prefix$$name$_.UnsafeArenaRelease(\n"
        "        $default_variable$, GetArenaNoVirtual());\n"
        "  } else {\n"
        "    return NULL;\n"
        "  }\n"
        "}\n"
        "$inline$void $classname$::set_allocated_$name$(::std::string* $name$) {\n"
        "  if (!has_$name$()) {\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  clear_$oneof_name$();\n"
        "  if ($name$ != NULL) {\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.SetAllocated($default_variable$, $name$,\n"
        "        GetArenaNoVirtual());\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
        "}\n"
        "$inline$void $classname$::unsafe_arena_set_allocated_$name$("
        "::std::string* $name$) {\n"
        "  GOOGLE_DCHECK(GetArenaNoVirtual() != NULL);\n"
        "  if (!has_$name$()) {\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  clear_$oneof_name$();\n"
        "  if ($name$) {\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeArenaSetAllocated($default_variable$, "
        "$name$, GetArenaNoVirtual());\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:"
        "$full_name$)\n"
        "}\n");
  } else {
    // No-arena case.
    printer->Print(
        variables,
        "$inline$const ::std::string& $classname$::$name$() const {\n"
        "  // @@protoc_insertion_point(field_get:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    return $oneof_prefix$$name$_.GetNoArena();\n"
        "  }\n"
        "  return *$default_variable$;\n"
        "}\n"
        "$inline$void $classname$::set_$name$(const ::std::string& value) {\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena($default_variable$, value);\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "}\n"
        "#if LANG_CXX11\n"
        "$inline$void $classname$::set_$name$(::std::string&& value) {\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena(\n"
        "    $default_variable$, ::std::move(value));\n"
        "  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n"
        "}\n"
        "#endif\n"
        "$inline$void $classname$::set_$name$(const char* value) {\n"
        "  $null_check$"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena($default_variable$,\n"
        "      $string_piece$(value));\n"
        "  // @@protoc_insertion_point(field_set_char:$full_name$)\n"
        "}\n"
        "$inline$"
        "void $classname$::set_$name$(const $pointer_type$* value, size_t "
        "size) {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena($default_variable$, "
        "$string_piece$(\n"
        "      reinterpret_cast<const char*>(value), size));\n"
        "  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n"
        "}\n"
        "$inline$::std::string* $classname$::mutable_$name$() {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
        "  return $oneof_prefix$$name$_.MutableNoArena($default_variable$);\n"
        "}\n"
        "$inline$::std::string* $classname$::$release_name$() {\n"
        "  // @@protoc_insertion_point(field_release:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    clear_has_$oneof_name$();\n"
        "    return $oneof_prefix$$name$_.ReleaseNoArena($default_variable$);\n"
        "  } else {\n"
        "    return NULL;\n"
        "  }\n"
        "}\n"
        "$inline$void $classname$::set_allocated_$name$(::std::string* $name$) {\n"
        "  if (!has_$name$()) {\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  clear_$oneof_name$();\n"
        "  if ($name$ != NULL) {\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.SetAllocatedNoArena($default_variable$,\n"
        "        $name$);\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
        "}\n");
  }
}